

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O0

bool __thiscall
DIS::ElectromagneticEmissionSystemData::operator==
          (ElectromagneticEmissionSystemData *this,ElectromagneticEmissionSystemData *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  ElectromagneticEmissionSystemData *rhs_local;
  ElectromagneticEmissionSystemData *this_local;
  
  idx._7_1_ = this->_emissionsPadding2 == rhs->_emissionsPadding2 &&
              this->_systemDataLength == rhs->_systemDataLength;
  bVar1 = EmitterSystem::operator==(&this->_emitterSystem,&rhs->_emitterSystem);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==(&this->_location,&rhs->_location);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  for (local_28 = 0;
      sVar2 = std::
              vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
              ::size(&this->_beamDataRecords), local_28 < sVar2; local_28 = local_28 + 1) {
    this_00 = std::
              vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
              ::operator[](&this->_beamDataRecords,local_28);
    rhs_00 = std::
             vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
             ::operator[](&rhs->_beamDataRecords,local_28);
    bVar1 = ElectromagneticEmissionBeamData::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
  }
  return idx._7_1_;
}

Assistant:

bool ElectromagneticEmissionSystemData::operator ==(const ElectromagneticEmissionSystemData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemDataLength == rhs._systemDataLength) ) ivarsEqual = false;
     if( ! (_emissionsPadding2 == rhs._emissionsPadding2) ) ivarsEqual = false;
     if( ! (_emitterSystem == rhs._emitterSystem) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
     {
        if( ! ( _beamDataRecords[idx] == rhs._beamDataRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }